

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_demultiplexer.h
# Opt level: O2

StreamDemultiplexer * __thiscall
StreamDemultiplexer::operator<<(StreamDemultiplexer *this,char (*obj) [2])

{
  pointer ppbVar1;
  
  for (ppbVar1 = (this->d).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppbVar1 !=
      (this->d).
      super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppbVar1 = ppbVar1 + 1) {
    std::operator<<(*ppbVar1,*obj);
  }
  return this;
}

Assistant:

StreamDemultiplexer& operator<<(const T& obj)
    {
        for (str_cont::iterator it = d.begin(); it != d.end(); ++it)
            (**it) << obj;
        return *this;
    }